

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O3

void __thiscall
pzgeom::TPZNodeRep<3,_pztopology::TPZTriangle>::Initialize
          (TPZNodeRep<3,_pztopology::TPZTriangle> *this,TPZVec<long> *nodeindexes)

{
  long *plVar1;
  long lVar2;
  ostream *this_00;
  size_t sVar3;
  stringstream sout;
  long *local_1c8;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if ((2 < nodeindexes->fNElements) && (nodeindexes->fNElements == 3)) {
    plVar1 = nodeindexes->fStore;
    this->fNodeIndexes[2] = plVar1[2];
    lVar2 = plVar1[1];
    this->fNodeIndexes[0] = *plVar1;
    this->fNodeIndexes[1] = lVar2;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,
             "void pzgeom::TPZNodeRep<3, pztopology::TPZTriangle>::Initialize(TPZVec<int64_t> &) [N = 3, Topology = pztopology::TPZTriangle]"
             ,0x7e);
  std::__ostream_insert<char,std::char_traits<char>>(local_198," Nodeindexes have wrong size ",0x1d)
  ;
  this_00 = std::ostream::_M_insert<long>((long)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," but should be ",0xf);
  std::ostream::operator<<(this_00,3);
  std::__cxx11::stringbuf::str();
  if (local_1c8 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a342a8);
  }
  else {
    sVar3 = strlen((char *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_1c8,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/pznoderep.h",
             0x71);
}

Assistant:

void Initialize(TPZVec<int64_t> &nodeindexes)
        {
            int64_t nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifndef PZNODEBUG
            if(nodeindexes.NElements() != N)
            {
                std::stringstream sout;
                sout << __PRETTY_FUNCTION__ << " Nodeindexes have wrong size " << nodeindexes.NElements() << " but should be " << N;
                std::cout << sout.str().c_str() << std::endl;
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int64_t i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
            
        }